

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpacktable_p.h
# Opt level: O2

void __thiscall HPack::HeaderField::~HeaderField(HeaderField *this)

{
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->value).d);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)this);
  return;
}

Assistant:

struct Q_AUTOTEST_EXPORT HeaderField
{
    HeaderField()
    {
    }

    HeaderField(const QByteArray &n, const QByteArray &v)
        : name(n),
          value(v)
    {
    }

    bool operator == (const HeaderField &rhs) const
    {
        return name == rhs.name && value == rhs.value;
    }

    QByteArray name;
    QByteArray value;
}